

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

string * __thiscall
FIX::UtcTimeStampConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeStampConvertor *this,UtcTimeStamp *value,
          int precision)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  byte bVar4;
  uint uVar5;
  undefined1 *puVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  char result [27];
  int day;
  int month;
  int year;
  undefined8 uStack_80;
  byte local_78 [2];
  undefined2 local_76;
  undefined1 local_74 [2];
  undefined1 local_72 [2];
  undefined1 local_70;
  undefined1 local_6f [2];
  undefined1 local_6d;
  undefined1 local_6c;
  byte local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  byte local_68;
  undefined1 local_67;
  undefined1 local_66 [14];
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  string *local_38;
  
  local_58 = (uint)value;
  uVar14 = 9;
  if ((int)local_58 < 9) {
    uVar14 = local_58;
  }
  uVar12 = 0;
  if (0 < (int)uVar14) {
    uVar12 = (ulong)uVar14;
  }
  uStack_80 = 0x1776ad;
  local_38 = __return_storage_ptr__;
  DateTime::getYMD(*(int *)(this + 8),(int *)&local_4c,(int *)&local_50,(int *)&local_54);
  uVar7 = *(ulong *)(this + 0x10);
  lVar15 = (long)((int)(SUB168(SEXT816((long)uVar7) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                 (SUB164(SEXT816((long)uVar7) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f));
  local_40 = uVar12;
  switch(uVar12) {
  case 0:
    break;
  case 1:
    local_40 = (uVar7 % 1000000000) / 100000000;
    break;
  case 2:
    local_40 = (uVar7 % 1000000000) / 10000000;
    break;
  case 3:
    local_40 = (uVar7 % 1000000000) / 1000000;
    break;
  case 4:
    local_40 = (uVar7 % 1000000000) / 100000;
    break;
  case 5:
    local_40 = (uVar7 % 1000000000) / 10000;
    break;
  case 6:
    local_40 = (uVar7 % 1000000000) / 1000;
    break;
  case 7:
    local_40 = (uVar7 % 1000000000) * 0x28f5c29;
    goto LAB_001778ae;
  case 8:
    local_40 = (uVar7 % 1000000000) * 0x1999999a;
LAB_001778ae:
    local_40 = local_40 >> 0x20;
    break;
  default:
    local_40 = (ulong)(uint)((int)uVar7 + (int)(uVar7 / 1000000000) * -1000000000);
  }
  puVar6 = local_74;
  uVar14 = -local_4c;
  if (0 < (int)local_4c) {
    uVar14 = local_4c;
  }
  uVar5 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar5 / 100;
      *(undefined2 *)(puVar6 + -2) = *(undefined2 *)(digit_pairs + (ulong)(uVar5 % 100) * 2);
      puVar6 = puVar6 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar1);
  }
  if (uVar14 < 10) {
    bVar4 = (byte)uVar14 | 0x30;
    lVar11 = -1;
  }
  else {
    puVar6[-1] = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
    bVar4 = digit_pairs[(ulong)uVar14 * 2];
    lVar11 = -2;
  }
  puVar8 = puVar6 + lVar11;
  puVar6[lVar11] = bVar4;
  if ((int)local_4c < 0) {
    puVar8[-1] = 0x2d;
    puVar8 = puVar8 + -1;
  }
  if (local_78 <= puVar8 && (long)puVar8 - (long)local_78 != 0) {
    uStack_80 = 0x17797d;
    memset(local_78,0x30,(long)puVar8 - (long)local_78);
  }
  uVar14 = -local_50;
  if (0 < (int)local_50) {
    uVar14 = local_50;
  }
  lVar11 = 6;
  uVar5 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar5 / 100;
      *(undefined2 *)(local_78 + lVar11 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar5 % 100) * 2);
      lVar11 = lVar11 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar1);
  }
  if (uVar14 < 10) {
    bVar4 = (byte)uVar14 | 0x30;
    lVar10 = -1;
  }
  else {
    local_78[lVar11 + -1] = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
    bVar4 = digit_pairs[(ulong)uVar14 * 2];
    lVar10 = -2;
  }
  lVar11 = lVar11 + lVar10;
  local_78[lVar11] = bVar4;
  if ((int)local_50 < 0) {
    local_78[lVar11 + -1] = 0x2d;
    lVar11 = lVar11 + -1;
  }
  if (4 < lVar11) {
    uStack_80 = 0x177a1e;
    memset(local_74,0x30,lVar11 - 4);
  }
  uVar14 = -local_54;
  if (0 < (int)local_54) {
    uVar14 = local_54;
  }
  lVar11 = 8;
  uVar5 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar5 / 100;
      *(undefined2 *)(local_78 + lVar11 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar5 % 100) * 2);
      lVar11 = lVar11 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar1);
  }
  if (uVar14 < 10) {
    bVar4 = (byte)uVar14 | 0x30;
    lVar10 = -1;
  }
  else {
    local_78[lVar11 + -1] = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
    bVar4 = digit_pairs[(ulong)uVar14 * 2];
    lVar10 = -2;
  }
  lVar11 = lVar11 + lVar10;
  local_78[lVar11] = bVar4;
  if ((int)local_54 < 0) {
    local_78[lVar11 + -1] = 0x2d;
    lVar11 = lVar11 + -1;
  }
  uVar14 = (int)(SUB168(SEXT816(lVar15) * SEXT816(0x48d159e26af37c05),8) >> 10) -
           (SUB164(SEXT816(lVar15) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f);
  local_48 = uVar12;
  if (6 < lVar11) {
    uStack_80 = 0x177ae3;
    memset(local_72,0x30,lVar11 - 6);
  }
  uVar2 = local_58;
  local_70 = 0x2d;
  uVar5 = -uVar14;
  if (0 < (int)uVar14) {
    uVar5 = uVar14;
  }
  lVar11 = 0xb;
  uVar14 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar14 / 100;
      *(undefined2 *)(local_78 + lVar11 + -2) =
           *(undefined2 *)(digit_pairs + (ulong)(uVar14 % 100) * 2);
      lVar11 = lVar11 + -2;
      bVar1 = 9999 < uVar14;
      uVar14 = uVar14 / 100;
    } while (bVar1);
  }
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar10 = -1;
  }
  else {
    local_78[lVar11 + -1] = digit_pairs[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = digit_pairs[(ulong)uVar5 * 2];
    lVar10 = -2;
  }
  lVar13 = (lVar15 / 0x3c) % 0x3c;
  lVar11 = lVar11 + lVar10;
  local_78[lVar11] = bVar4;
  if (lVar15 < -0xe0f) {
    local_78[lVar11 + -1] = 0x2d;
    lVar11 = lVar11 + -1;
  }
  if (9 < lVar11) {
    uStack_80 = 0x177b99;
    memset(local_6f,0x30,lVar11 - 9);
  }
  uVar12 = local_48;
  local_6d = 0x3a;
  uVar5 = (uint)lVar13;
  uVar14 = -uVar5;
  if (0 < (int)uVar5) {
    uVar14 = uVar5;
  }
  if (uVar14 < 10) {
    local_6b = (byte)uVar14 | 0x30;
    lVar11 = 0xd;
  }
  else {
    local_6b = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
    local_6c = digit_pairs[(ulong)uVar14 * 2];
    lVar11 = 0xc;
  }
  if (lVar13 < 0) {
    local_78[lVar11 + -1] = 0x2d;
    lVar11 = lVar11 + -1;
  }
  if (0xc < lVar11) {
    uStack_80 = 0x177c09;
    memset(&local_6c,0x30,lVar11 - 0xc);
  }
  local_6a = 0x3a;
  uVar5 = (uint)(lVar15 % 0x3c);
  uVar14 = -uVar5;
  if (0 < (int)uVar5) {
    uVar14 = uVar5;
  }
  if (uVar14 < 10) {
    local_68 = (byte)uVar14 | 0x30;
    lVar11 = 0x10;
  }
  else {
    local_68 = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
    local_69 = digit_pairs[(ulong)uVar14 * 2];
    lVar11 = 0xf;
  }
  if (lVar15 % 0x3c < 0) {
    local_78[lVar11 + -1] = 0x2d;
    lVar11 = lVar11 + -1;
  }
  if (0xf < lVar11) {
    uStack_80 = 0x177c6c;
    memset(&local_69,0x30,lVar11 - 0xf);
  }
  if (0 < (int)uVar2) {
    local_67 = 0x2e;
    uVar9 = (ulong)((int)uVar12 + 0x12);
    uVar7 = (ulong)(uint)-(int)local_40;
    if (0 < (int)local_40) {
      uVar7 = local_40 & 0xffffffff;
    }
    uVar14 = (uint)uVar7;
    if (99 < uVar14) {
      do {
        uVar5 = (uint)uVar7;
        uVar14 = (uint)(uVar7 / 100);
        uVar7 = uVar7 / 100;
        *(undefined2 *)(local_78 + (uVar9 - 2)) =
             *(undefined2 *)(digit_pairs + (ulong)(uVar5 + (int)uVar7 * -100) * 2);
        uVar9 = uVar9 - 2;
      } while (9999 < uVar5);
    }
    if (uVar14 < 10) {
      bVar4 = (byte)uVar14 | 0x30;
      lVar15 = -1;
    }
    else {
      local_78[uVar9 - 1] = digit_pairs[((ulong)uVar14 * 2 & 0xffffffff) + 1];
      bVar4 = digit_pairs[(ulong)uVar14 * 2];
      lVar15 = -2;
    }
    lVar15 = uVar9 + lVar15;
    local_78[lVar15] = bVar4;
    if (0x12 < lVar15) {
      uStack_80 = 0x177d08;
      memset(local_66,0x30,lVar15 - 0x12);
    }
  }
  psVar3 = local_38;
  uVar7 = 0x11;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)((int)uVar12 + 0x12);
  }
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  uStack_80 = 0x177d32;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,local_78,local_78 + uVar7);
  return psVar3;
}

Assistant:

EXCEPT(FieldConvertError) {
    char result[17 + 10]; // Maximum
    int year, month, day, hour, minute, second, fraction;

    precision = clamp_of(precision, 0, 9);

    value.getYMD(year, month, day);
    value.getHMS(hour, minute, second, fraction, precision);

    integer_to_string_padded(result, 4, year);
    integer_to_string_padded(result + 4, 2, month);
    integer_to_string_padded(result + 6, 2, day);
    result[8] = '-';
    integer_to_string_padded(result + 9, 2, hour);
    result[11] = ':';
    integer_to_string_padded(result + 12, 2, minute);
    result[14] = ':';
    integer_to_string_padded(result + 15, 2, second);

    if (precision) {
      result[17] = '.';
      integer_to_string_padded(result + 18, precision, fraction);
    }

    return std::string(result, precision ? (17 + 1 + precision) : 17);
  }